

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O0

void __thiscall despot::BaseTag::CreatePOMCPPrior(BaseTag *this)

{
  string *in_RSI;
  
  CreatePOMCPPrior((BaseTag *)
                   &this[-1].memory_pool_.freelist_.
                    super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish,in_RSI);
  return;
}

Assistant:

POMCPPrior* BaseTag::CreatePOMCPPrior(string name) const {
	if (name == "UNIFORM") {
		return new UniformPOMCPPrior(this);
	} else if (name == "DEFAULT" || name == "SHR") {
		return new TagPOMCPPrior(this);
	} else {
		cerr << "Unsupported POMCP prior: " << name << endl;
		exit(1);
		return NULL;
	}
}